

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

float __thiscall Matrix4f::determinant(Matrix4f *this)

{
  float fVar1;
  float m12;
  float m22;
  float fVar2;
  float m00;
  float m10;
  float m20;
  float fVar3;
  float m01;
  float m11;
  float m21;
  float fVar4;
  float m12_00;
  float m22_00;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = this->m_elements[0];
  fVar8 = this->m_elements[1];
  m12 = this->m_elements[2];
  m22 = this->m_elements[3];
  fVar2 = this->m_elements[4];
  m00 = this->m_elements[5];
  m10 = this->m_elements[6];
  m20 = this->m_elements[7];
  fVar3 = this->m_elements[8];
  m01 = this->m_elements[9];
  m11 = this->m_elements[10];
  m21 = this->m_elements[0xb];
  fVar4 = this->m_elements[0xc];
  fVar7 = this->m_elements[0xd];
  m12_00 = this->m_elements[0xe];
  m22_00 = this->m_elements[0xf];
  fVar5 = Matrix3f::determinant3x3(m00,m01,fVar7,m10,m11,m12_00,m20,m21,m22_00);
  fVar6 = Matrix3f::determinant3x3(m01,fVar7,fVar8,m11,m12_00,m12,m21,m22_00,m22);
  fVar7 = Matrix3f::determinant3x3(fVar7,fVar8,m00,m12_00,m12,m10,m22_00,m22,m20);
  fVar8 = Matrix3f::determinant3x3(fVar8,m00,m01,m12,m10,m11,m22,m20,m21);
  return (fVar7 * fVar3 + (fVar5 * fVar1 - fVar6 * fVar2)) - fVar8 * fVar4;
}

Assistant:

float Matrix4f::determinant() const
{
	float m00 = m_elements[ 0 ];
	float m10 = m_elements[ 1 ];
	float m20 = m_elements[ 2 ];
	float m30 = m_elements[ 3 ];

	float m01 = m_elements[ 4 ];
	float m11 = m_elements[ 5 ];
	float m21 = m_elements[ 6 ];
	float m31 = m_elements[ 7 ];

	float m02 = m_elements[ 8 ];
	float m12 = m_elements[ 9 ];
	float m22 = m_elements[ 10 ];
	float m32 = m_elements[ 11 ];

	float m03 = m_elements[ 12 ];
	float m13 = m_elements[ 13 ];
	float m23 = m_elements[ 14 ];
	float m33 = m_elements[ 15 ];

	float cofactor00 =  Matrix3f::determinant3x3( m11, m12, m13, m21, m22, m23, m31, m32, m33 );
	float cofactor01 = -Matrix3f::determinant3x3( m12, m13, m10, m22, m23, m20, m32, m33, m30 );
	float cofactor02 =  Matrix3f::determinant3x3( m13, m10, m11, m23, m20, m21, m33, m30, m31 );
	float cofactor03 = -Matrix3f::determinant3x3( m10, m11, m12, m20, m21, m22, m30, m31, m32 );

	return( m00 * cofactor00 + m01 * cofactor01 + m02 * cofactor02 + m03 * cofactor03 );
}